

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O1

gnode_t * gnode_function_decl_create
                    (gtoken_s token,char *identifier,gtoken_t access_specifier,
                    gtoken_t storage_specifier,gnode_r *params,gnode_compound_stmt_t *block,
                    gnode_t *decl)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x88);
  pgVar1->tag = NODE_FUNCTION_DECL;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  *(char **)&pgVar1[1].token.colno = identifier;
  pgVar1[1].block_length = access_specifier;
  *(gtoken_t *)&pgVar1[1].field_0xc = storage_specifier;
  *(gnode_r **)&pgVar1[1].token.bytes = params;
  *(gnode_compound_stmt_t **)&pgVar1[1].token.fileid = block;
  *(undefined2 *)&pgVar1[1].token.value = 0;
  *(undefined8 *)&pgVar1[1].is_assignment = 0;
  return pgVar1;
}

Assistant:

gnode_t *gnode_function_decl_create (gtoken_s token, const char *identifier, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_r *params,
                                     gnode_compound_stmt_t *block, gnode_t *decl) {
    gnode_function_decl_t *node = (gnode_function_decl_t *)mem_alloc(NULL, sizeof(gnode_function_decl_t));

    SETBASE(node, NODE_FUNCTION_DECL, token);
    SETDECL(node, decl);
    node->identifier = identifier;
    node->access = access_specifier;
    node->storage = storage_specifier;
    node->params = params;
    node->block = block;
    node->nlocals = 0;
    node->uplist = NULL;

    return (gnode_t *)node;
}